

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O0

FT_Error ft_outline_glyph_copy(FT_Glyph outline_source,FT_Glyph outline_target)

{
  FT_Error FVar1;
  FT_Library library;
  FT_Error error;
  FT_OutlineGlyph target;
  FT_OutlineGlyph source;
  FT_Glyph outline_target_local;
  FT_Glyph outline_source_local;
  
  FVar1 = FT_Outline_New(outline_source->library,
                         (int)*(short *)((long)&outline_source[1].library + 2),
                         (int)*(short *)&outline_source[1].library,
                         (FT_Outline *)(outline_target + 1));
  if (FVar1 == 0) {
    FT_Outline_Copy((FT_Outline *)(outline_source + 1),(FT_Outline *)(outline_target + 1));
  }
  return FVar1;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  ft_outline_glyph_copy( FT_Glyph  outline_source,
                         FT_Glyph  outline_target )
  {
    FT_OutlineGlyph  source  = (FT_OutlineGlyph)outline_source;
    FT_OutlineGlyph  target  = (FT_OutlineGlyph)outline_target;
    FT_Error         error;
    FT_Library       library = FT_GLYPH( source )->library;


    error = FT_Outline_New( library,
                            (FT_UInt)source->outline.n_points,
                            source->outline.n_contours,
                            &target->outline );
    if ( !error )
      FT_Outline_Copy( &source->outline, &target->outline );

    return error;
  }